

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void __thiscall
absl::strings_internal::AppendPieces
          (strings_internal *this,string *dest,initializer_list<absl::string_view> pieces)

{
  bool bVar1;
  reference pcVar2;
  initializer_list<absl::string_view> *piVar3;
  size_type sVar4;
  const_pointer pcVar5;
  long lVar6;
  ulong uVar7;
  size_t this_size;
  string_view piece_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<absl::string_view> *__range2_1;
  char *out;
  reference local_60;
  char *begin;
  string_view piece;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<absl::string_view> *__range2;
  size_t total_size;
  size_t old_size;
  string *dest_local;
  initializer_list<absl::string_view> pieces_local;
  
  pieces_local._M_array = pieces._M_array;
  dest_local = dest;
  piVar3 = (initializer_list<absl::string_view> *)std::__cxx11::string::size();
  __end2 = std::initializer_list<absl::string_view>::begin
                     ((initializer_list<absl::string_view> *)&dest_local);
  piece.length_ =
       (size_type)
       std::initializer_list<absl::string_view>::end
                 ((initializer_list<absl::string_view> *)&dest_local);
  __range2 = piVar3;
  for (; __end2 != (const_iterator)piece.length_; __end2 = __end2 + 1) {
    begin = __end2->ptr_;
    piece.ptr_ = (char *)__end2->length_;
    sVar4 = string_view::size((string_view *)&begin);
    bVar1 = true;
    if (sVar4 != 0) {
      pcVar5 = string_view::data((string_view *)&begin);
      lVar6 = std::__cxx11::string::data();
      uVar7 = std::__cxx11::string::size();
      bVar1 = uVar7 < (ulong)((long)pcVar5 - lVar6);
    }
    if (!bVar1) {
      __assert_fail("((piece).size() == 0) || (uintptr_t((piece).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                    ,0xaa,
                    "void absl::strings_internal::AppendPieces(string *, std::initializer_list<absl::string_view>)"
                   );
    }
    sVar4 = string_view::size((string_view *)&begin);
    __range2 = (initializer_list<absl::string_view> *)((long)&__range2->_M_array + sVar4);
  }
  STLStringResizeUninitialized<std::__cxx11::string,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (size_t)__range2);
  out = (char *)std::__cxx11::string::begin();
  local_60 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  __range2_1 = (initializer_list<absl::string_view> *)(local_60 + (long)piVar3);
  __end2_1 = std::initializer_list<absl::string_view>::begin
                       ((initializer_list<absl::string_view> *)&dest_local);
  piece_1.length_ =
       (size_type)
       std::initializer_list<absl::string_view>::end
                 ((initializer_list<absl::string_view> *)&dest_local);
  for (; pcVar2 = local_60, __end2_1 != (const_iterator)piece_1.length_; __end2_1 = __end2_1 + 1) {
    this_size = (size_t)__end2_1->ptr_;
    piece_1.ptr_ = (char *)__end2_1->length_;
    sVar4 = string_view::size((string_view *)&this_size);
    pcVar5 = string_view::data((string_view *)&this_size);
    memcpy(__range2_1,pcVar5,sVar4);
    __range2_1 = (initializer_list<absl::string_view> *)((long)&__range2_1->_M_array + sVar4);
  }
  lVar6 = std::__cxx11::string::size();
  if (__range2_1 == (initializer_list<absl::string_view> *)(pcVar2 + lVar6)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0xb6,
                "void absl::strings_internal::AppendPieces(string *, std::initializer_list<absl::string_view>)"
               );
}

Assistant:

void AppendPieces(string* dest,
                  std::initializer_list<absl::string_view> pieces) {
  size_t old_size = dest->size();
  size_t total_size = old_size;
  for (const absl::string_view piece : pieces) {
    ASSERT_NO_OVERLAP(*dest, piece);
    total_size += piece.size();
  }
  strings_internal::STLStringResizeUninitialized(dest, total_size);

  char* const begin = &*dest->begin();
  char* out = begin + old_size;
  for (const absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    memcpy(out, piece.data(), this_size);
    out += this_size;
  }
  assert(out == begin + dest->size());
}